

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_next(archive *a,archive_acl *acl,wchar_t want_type,wchar_t *type,
                        wchar_t *permset,wchar_t *tag,wchar_t *id,char **name)

{
  wchar_t wVar1;
  int *piVar2;
  archive_acl_entry *paVar3;
  
  *name = (char *)0x0;
  *id = L'\xffffffff';
  wVar1 = acl->acl_state;
  if (wVar1 == L'\0') {
    return L'\xffffffec';
  }
  if (((uint)want_type >> 8 & 1) == 0) {
LAB_001789ad:
    paVar3 = acl->acl_p;
    while (paVar3 != (archive_acl_entry *)0x0) {
      if ((paVar3->type & want_type) != 0) {
        *type = paVar3->type;
        *permset = paVar3->permset;
        *tag = paVar3->tag;
        *id = paVar3->id;
        wVar1 = archive_mstring_get_mbs(a,&paVar3->name,name);
        if (wVar1 != L'\0') {
          piVar2 = __errno_location();
          if (*piVar2 == 0xc) {
            return L'\xffffffe2';
          }
          *name = (char *)0x0;
        }
        paVar3 = acl->acl_p->next;
        goto LAB_00178aa7;
      }
      paVar3 = paVar3->next;
      acl->acl_p = paVar3;
    }
    acl->acl_state = L'\0';
    *type = L'\0';
    *permset = L'\0';
    *tag = L'\0';
    *id = L'\xffffffff';
    *name = (char *)0x0;
    wVar1 = L'\x01';
  }
  else {
    if (wVar1 == L'✖') {
      *permset = acl->mode & 7;
      *type = L'Ā';
      *tag = L'✖';
      acl->acl_state = L'\xffffffff';
      paVar3 = acl->acl_head;
LAB_00178aa7:
      acl->acl_p = paVar3;
    }
    else if (wVar1 == L'✔') {
      *permset = acl->mode >> 3 & 7;
      *type = L'Ā';
      *tag = L'✔';
      acl->acl_state = L'✖';
    }
    else {
      if (wVar1 != L'✒') goto LAB_001789ad;
      *permset = acl->mode >> 6 & 7;
      *type = L'Ā';
      *tag = L'✒';
      acl->acl_state = L'✔';
    }
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

int
archive_acl_next(struct archive *a, struct archive_acl *acl, int want_type, int *type,
    int *permset, int *tag, int *id, const char **name)
{
	*name = NULL;
	*id = -1;

	/*
	 * The acl_state is either zero (no entries available), -1
	 * (reading from list), or an entry type (retrieve that type
	 * from ae_stat.aest_mode).
	 */
	if (acl->acl_state == 0)
		return (ARCHIVE_WARN);

	/* The first three access entries are special. */
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		switch (acl->acl_state) {
		case ARCHIVE_ENTRY_ACL_USER_OBJ:
			*permset = (acl->mode >> 6) & 7;
			*type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
			*tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
			acl->acl_state = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
			return (ARCHIVE_OK);
		case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
			*permset = (acl->mode >> 3) & 7;
			*type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
			*tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
			acl->acl_state = ARCHIVE_ENTRY_ACL_OTHER;
			return (ARCHIVE_OK);
		case ARCHIVE_ENTRY_ACL_OTHER:
			*permset = acl->mode & 7;
			*type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
			*tag = ARCHIVE_ENTRY_ACL_OTHER;
			acl->acl_state = -1;
			acl->acl_p = acl->acl_head;
			return (ARCHIVE_OK);
		default:
			break;
		}
	}

	while (acl->acl_p != NULL && (acl->acl_p->type & want_type) == 0)
		acl->acl_p = acl->acl_p->next;
	if (acl->acl_p == NULL) {
		acl->acl_state = 0;
		*type = 0;
		*permset = 0;
		*tag = 0;
		*id = -1;
		*name = NULL;
		return (ARCHIVE_EOF); /* End of ACL entries. */
	}
	*type = acl->acl_p->type;
	*permset = acl->acl_p->permset;
	*tag = acl->acl_p->tag;
	*id = acl->acl_p->id;
	if (archive_mstring_get_mbs(a, &acl->acl_p->name, name) != 0) {
		if (errno == ENOMEM)
			return (ARCHIVE_FATAL);
		*name = NULL;
	}
	acl->acl_p = acl->acl_p->next;
	return (ARCHIVE_OK);
}